

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

void Jf_ManTestCnf(Gia_Man_t *p)

{
  Cnf_Dat_t *p_00;
  Gia_Man_t *p_01;
  ulong uVar1;
  
  p_01 = Jf_ManDeriveCnf(p,1);
  p_00 = (Cnf_Dat_t *)p_01->pData;
  p_01->pData = (void *)0x0;
  Cnf_DataWriteIntoFile(p_00,"test.cnf",0,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  for (uVar1 = 0; (long)uVar1 < (long)p_00->nVars; uVar1 = uVar1 + 1) {
    printf("%d : %d %d\n",uVar1 & 0xffffffff,(ulong)(uint)p_00->pObj2Count[uVar1],
           (ulong)(uint)p_00->pObj2Clause[uVar1]);
  }
  Gia_ManStop(p_01);
  Cnf_DataFree(p_00);
  return;
}

Assistant:

void Jf_ManTestCnf( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Cnf_Dat_t * pCnf;
    int i;
//    Cnf_Dat_t * pCnf = Cnf_DeriveGia( p );
    pNew = Jf_ManDeriveCnf( p, 1 );
    pCnf = (Cnf_Dat_t *)pNew->pData; pNew->pData = NULL;
    Cnf_DataWriteIntoFile( pCnf, "test.cnf", 0, NULL, NULL );
    for ( i = 0; i < pCnf->nVars; i++ )
        printf( "%d : %d %d\n", i, pCnf->pObj2Count[i], pCnf->pObj2Clause[i] );
    Gia_ManStop( pNew );
    Cnf_DataFree(pCnf);
}